

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O3

bool __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::IsEmpty(SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  pthread_mutex_t *__mutex;
  size_t sVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)
            (this->_mutex).super___shared_ptr<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    sVar1 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pthread_mutex_unlock(__mutex);
    return sVar1 == 0;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

virtual bool IsEmpty() const
    {
        Lock l(*_mutex);
        return _map.empty();
    }